

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_pushstring(lua_State *L,char *str)

{
  ulong uVar1;
  size_t lenx;
  GCstr *pGVar2;
  TValue *pTVar3;
  uint32_t uStack_20;
  
  if (str == (char *)0x0) {
    pTVar3 = L->top;
    uStack_20 = 0xffffffff;
  }
  else {
    uVar1 = (ulong)(L->glref).ptr32;
    if (*(uint *)(uVar1 + 0x54) <= *(uint *)(uVar1 + 0x50)) {
      lj_gc_step(L);
    }
    lenx = strlen(str);
    pGVar2 = lj_str_new(L,str,lenx);
    pTVar3 = L->top;
    (pTVar3->u32).lo = (uint32_t)pGVar2;
    uStack_20 = 0xfffffffb;
  }
  (pTVar3->field_2).it = uStack_20;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if (pTVar3 + 1 < (TValue *)(ulong)(L->maxstack).ptr32) {
    return;
  }
  lj_state_growstack1(L);
  return;
}

Assistant:

LUA_API void lua_pushstring(lua_State *L, const char *str)
{
  if (str == NULL) {
    setnilV(L->top);
  } else {
    GCstr *s;
    lj_gc_check(L);
    s = lj_str_newz(L, str);
    setstrV(L, L->top, s);
  }
  incr_top(L);
}